

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O3

bool __thiscall
IRT::MemFromConstPlusRegPattern::TryToGenerateCode
          (MemFromConstPlusRegPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  int iVar1;
  CMemExpression *this_00;
  CExpression *pCVar2;
  CBinopExpression *this_01;
  CTempExpression *this_02;
  CTemp *__args_1;
  INode *pIVar3;
  CTemp source;
  undefined1 local_a9;
  CConstExpression *local_a8;
  undefined1 local_a0 [32];
  INode *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68 [8];
  undefined8 uStack_60;
  INode *local_58;
  CTemp local_50;
  
  if (tree != (INode *)0x0) {
    this_00 = (CMemExpression *)__dynamic_cast(tree,&INode::typeinfo,&CMemExpression::typeinfo,0);
    if (this_00 == (CMemExpression *)0x0) {
      return false;
    }
    pCVar2 = CMemExpression::getAddress(this_00);
    if (pCVar2 != (CExpression *)0x0) {
      this_01 = (CBinopExpression *)
                __dynamic_cast(pCVar2,&CExpression::typeinfo,&CBinopExpression::typeinfo,0);
      if (this_01 == (CBinopExpression *)0x0) {
        return false;
      }
      pCVar2 = CBinopExpression::getLeftOperand(this_01);
      if (pCVar2 != (CExpression *)0x0) {
        local_a8 = (CConstExpression *)
                   __dynamic_cast(pCVar2,&CExpression::typeinfo,&CConstExpression::typeinfo,0);
        if (local_a8 != (CConstExpression *)0x0) {
          pCVar2 = CBinopExpression::getRightOperand(this_01);
          if ((pCVar2 == (CExpression *)0x0) ||
             (this_02 = (CTempExpression *)
                        __dynamic_cast(pCVar2,&CExpression::typeinfo,&CTempExpression::typeinfo,0),
             this_02 == (CTempExpression *)0x0)) {
            CTemp::CTemp(&local_50);
            pIVar3 = (INode *)CMemExpression::getAddress(this_00);
            local_78._M_allocated_capacity = (size_type)local_68;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_78,local_50.name._M_dataplus._M_p,
                       local_50.name._M_dataplus._M_p + local_50.name._M_string_length);
            if ((undefined1 *)local_78._M_allocated_capacity == local_68) {
              local_a0._24_8_ = uStack_60;
              local_a0._0_8_ = (element_type *)(local_a0 + 0x10);
            }
            else {
              local_a0._0_8_ = local_78._M_allocated_capacity;
            }
            local_a0._8_8_ = local_78._8_8_;
            local_78._8_8_ = 0;
            local_68[0] = 0;
            local_80 = pIVar3;
            local_78._M_allocated_capacity = (size_type)local_68;
            local_58 = pIVar3;
            std::
            vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
            ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                      ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                        *)children,(pair<IRT::CTemp,_const_IRT::INode_*> *)local_a0);
            if ((element_type *)local_a0._0_8_ != (element_type *)(local_a0 + 0x10)) {
              operator_delete((void *)local_a0._0_8_);
            }
            if ((undefined1 *)local_78._M_allocated_capacity != local_68) {
              operator_delete((void *)local_78._M_allocated_capacity);
            }
            iVar1 = CConstExpression::getValue(local_a8);
            local_78._M_allocated_capacity._0_4_ = iVar1;
            local_a0._0_8_ = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<AssemblyCode::MoveMemFromRegPlusConstToReg,std::allocator<AssemblyCode::MoveMemFromRegPlusConstToReg>,IRT::CTemp_const&,IRT::CTemp&,int>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8),
                       (MoveMemFromRegPlusConstToReg **)local_a0,
                       (allocator<AssemblyCode::MoveMemFromRegPlusConstToReg> *)&local_a9,dest,
                       &local_50,(int *)local_78._M_local_buf);
            std::
            vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
            ::emplace_back<std::shared_ptr<AssemblyCode::MoveMemFromRegPlusConstToReg>>
                      ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                        *)commands,
                       (shared_ptr<AssemblyCode::MoveMemFromRegPlusConstToReg> *)local_a0);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50.name._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&local_50.name + 0x10U)) {
              operator_delete(local_50.name._M_dataplus._M_p);
            }
          }
          else {
            __args_1 = CTempExpression::getTemprorary(this_02);
            local_78._M_allocated_capacity._0_4_ = CConstExpression::getValue(local_a8);
            local_a0._0_8_ = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<AssemblyCode::MoveMemFromRegPlusConstToReg,std::allocator<AssemblyCode::MoveMemFromRegPlusConstToReg>,IRT::CTemp_const&,IRT::CTemp_const&,int>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8),
                       (MoveMemFromRegPlusConstToReg **)local_a0,
                       (allocator<AssemblyCode::MoveMemFromRegPlusConstToReg> *)&local_50,dest,
                       __args_1,(int *)local_78._M_local_buf);
            std::
            vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
            ::emplace_back<std::shared_ptr<AssemblyCode::MoveMemFromRegPlusConstToReg>>
                      ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                        *)commands,
                       (shared_ptr<AssemblyCode::MoveMemFromRegPlusConstToReg> *)local_a0);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
            }
          }
          return true;
        }
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool IRT::MemFromConstPlusRegPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest,
                                                         ChildrenTemps &children, AssemblyCommands &commands ) {
    ConstMemPtr memPtr = dynamic_cast<ConstMemPtr>(tree);
    if ( memPtr ) {
        ConstBinopPtr constBinopPtr = dynamic_cast<ConstBinopPtr>(memPtr->getAddress( ));
        if ( constBinopPtr ) {
            ConstConstPtr constPtr = dynamic_cast<ConstConstPtr>(constBinopPtr->getLeftOperand( ));
            if ( constPtr ) {
                ConstTempPtr constTempPtr = dynamic_cast<ConstTempPtr>(constBinopPtr->getRightOperand( ));
                if ( constTempPtr ) {
                    commands.emplace_back(
                            std::make_shared<AssemblyCode::MoveMemFromRegPlusConstToReg>( dest,
                                                                                          constTempPtr->getTemprorary( ),
                                                                                          constPtr->getValue( )));
                } else {
                    CTemp source;
                    children.push_back( std::make_pair( source, memPtr->getAddress( )));
                    commands.emplace_back(
                            std::make_shared<AssemblyCode::MoveMemFromRegPlusConstToReg>( dest, source,
                                                                                          constPtr->getValue( )));
                }
                return true;
            }
        }
    }
    return false;
}